

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_overflowCorrectIfNeeded
               (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *ip,void *iend)

{
  U32 UVar1;
  U32 maxDist_00;
  U32 UVar2;
  U32 correction;
  U32 maxDist;
  U32 cycleLog;
  void *iend_local;
  void *ip_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_cwksp *ws_local;
  ZSTD_matchState_t *ms_local;
  
  UVar1 = ZSTD_cycleLog((params->cParams).chainLog,(params->cParams).strategy);
  maxDist_00 = 1 << ((byte)(params->cParams).windowLog & 0x1f);
  UVar2 = ZSTD_window_needOverflowCorrection(ms->window,UVar1,maxDist_00,ms->loadedDictEnd,ip,iend);
  if (UVar2 != 0) {
    UVar1 = ZSTD_window_correctOverflow(&ms->window,UVar1,maxDist_00,ip);
    ZSTD_cwksp_mark_tables_dirty(ws);
    ZSTD_reduceIndex(ms,params,UVar1);
    ZSTD_cwksp_mark_tables_clean(ws);
    if (ms->nextToUpdate < UVar1) {
      ms->nextToUpdate = 0;
    }
    else {
      ms->nextToUpdate = ms->nextToUpdate - UVar1;
    }
    ms->loadedDictEnd = 0;
    ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  }
  return;
}

Assistant:

static void ZSTD_overflowCorrectIfNeeded(ZSTD_matchState_t* ms,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         void const* ip,
                                         void const* iend)
{
    U32 const cycleLog = ZSTD_cycleLog(params->cParams.chainLog, params->cParams.strategy);
    U32 const maxDist = (U32)1 << params->cParams.windowLog;
    if (ZSTD_window_needOverflowCorrection(ms->window, cycleLog, maxDist, ms->loadedDictEnd, ip, iend)) {
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, maxDist, ip);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
        ZSTD_cwksp_mark_tables_dirty(ws);
        ZSTD_reduceIndex(ms, params, correction);
        ZSTD_cwksp_mark_tables_clean(ws);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        /* invalidate dictionaries on overflow correction */
        ms->loadedDictEnd = 0;
        ms->dictMatchState = NULL;
    }
}